

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O3

void __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
::Initialize(Node<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
             *this,pair<unsigned_long,_duckdb::dtime_t> *value)

{
  pointer pNVar1;
  ulong uVar2;
  
  (this->_value).first = value->first;
  (this->_value).second.micros = (value->second).micros;
  (this->_nodeRefs)._swapLevel = 0;
  pNVar1 = (this->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_nodeRefs)._nodes.
      super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar1) {
    (this->_nodeRefs)._nodes.
    super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar1;
  }
  do {
    SwappableNodeRefStack<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
    ::push_back(&this->_nodeRefs,this,
                (ulong)((this->_nodeRefs)._nodes.
                        super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish ==
                       (this->_nodeRefs)._nodes.
                       super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start));
    uVar2 = (this->_pool->prng).state_;
    (this->_pool->prng).state_ = uVar2 * 0x5851f42d4c957f2d;
  } while ((uint)((uVar2 >> 0x16 ^ uVar2) >> (byte)(uVar2 >> 0x3d) + 0x16) < 0x7fffffff);
  return;
}

Assistant:

void Initialize(const T &value) {
		_value = value;
		_nodeRefs.clear();
		do {
			_nodeRefs.push_back(this, _nodeRefs.height() ? 0 : 1);
		} while (_pool.prng() < _pool.prng.max() / 2);
	}